

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_1::RboSizeCase::test(RboSizeCase *this)

{
  GLenum reference;
  GLenum reference_00;
  GLint h;
  GLint w;
  int i;
  int numIterations;
  GLuint local_24;
  undefined1 local_20 [4];
  GLuint renderbufferID;
  Random rnd;
  RboSizeCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  local_24 = 0;
  glu::CallLogWrapper::glGenRenderbuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_24);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,local_24);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d42,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d43,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (h = 0; h < 0x3c; h = h + 1) {
    reference = de::Random::getInt((Random *)local_20,0,0x80);
    reference_00 = de::Random::getInt((Random *)local_20,0,0x80);
    glu::CallLogWrapper::glRenderbufferStorage
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,0x8051,reference,reference_00);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d42,reference);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d43,reference_00);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_24);
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		0);
		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	0);
		expectError(GL_NO_ERROR);

		const int numIterations = 60;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLint w = rnd.getInt(0, 128);
			const GLint h = rnd.getInt(0, 128);

			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGB8, w, h);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_WIDTH,		w);
			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_HEIGHT,	h);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}